

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall kj::Path::Path(Path *this,String *name)

{
  char *pcVar1;
  ArrayDisposer *pAVar2;
  size_t sVar3;
  String *pSVar4;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar5;
  Path *this_00;
  StringPtr part;
  
  pSVar4 = (String *)
           _::HeapArrayDisposer::allocateImpl
                     (0x18,1,1,_::HeapArrayDisposer::Allocate_<kj::String>::construct,
                      ArrayDisposer::Dispose_<kj::String>::destruct);
  (this->parts).ptr = pSVar4;
  (this->parts).size_ = 1;
  (this->parts).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pcVar1 = (pSVar4->content).ptr;
  sVar5 = extraout_RDX;
  if (pcVar1 != (char *)0x0) {
    sVar5 = (pSVar4->content).size_;
    pAVar2 = (pSVar4->content).disposer;
    (pSVar4->content).ptr = (char *)0x0;
    (pSVar4->content).size_ = 0;
    (**pAVar2->_vptr_ArrayDisposer)(pAVar2,pcVar1,1,sVar5,sVar5,0);
    sVar5 = extraout_RDX_00;
  }
  (pSVar4->content).ptr = (name->content).ptr;
  (pSVar4->content).size_ = (name->content).size_;
  (pSVar4->content).disposer = (name->content).disposer;
  (name->content).ptr = (char *)0x0;
  (name->content).size_ = 0;
  pSVar4 = (this->parts).ptr;
  sVar3 = (pSVar4->content).size_;
  if (sVar3 == 0) {
    this_00 = (Path *)0x203442;
  }
  else {
    this_00 = (Path *)(pSVar4->content).ptr;
  }
  part.content.ptr = (char *)(sVar3 + (sVar3 == 0));
  part.content.size_ = sVar5;
  validatePart(this_00,part);
  return;
}

Assistant:

Path::Path(String&& name): parts(heapArray<String>(1)) {
  parts[0] = kj::mv(name);
  validatePart(parts[0]);
}